

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

cmCPackIFWPackage * __thiscall
cmCPackIFWGenerator::GetComponentPackage(cmCPackIFWGenerator *this,cmCPackComponent *component)

{
  bool bVar1;
  pointer ppVar2;
  cmCPackIFWPackage *local_38;
  _Self local_28;
  _Self local_20;
  const_iterator pit;
  cmCPackComponent *component_local;
  cmCPackIFWGenerator *this_local;
  
  pit._M_node = (_Base_ptr)component;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<cmCPackComponent_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponent_*>,_std::allocator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>_>
       ::find(&this->ComponentPackages,(key_type *)&pit);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<cmCPackComponent_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponent_*>,_std::allocator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>_>
       ::end(&this->ComponentPackages);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>
             ::operator->(&local_20);
    local_38 = ppVar2->second;
  }
  else {
    local_38 = (cmCPackIFWPackage *)0x0;
  }
  return local_38;
}

Assistant:

cmCPackIFWPackage* cmCPackIFWGenerator::GetComponentPackage(
  cmCPackComponent* component) const
{
  auto pit = this->ComponentPackages.find(component);
  return pit != this->ComponentPackages.end() ? pit->second : nullptr;
}